

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::accessChainGetInferredType(Builder *this)

{
  Instruction *pIVar1;
  Id IVar2;
  uint member;
  ulong uVar3;
  Id *pIVar4;
  
  uVar3 = (ulong)(this->accessChain).base;
  if (uVar3 == 0) {
    IVar2 = 0;
  }
  else {
    pIVar1 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3];
    if (pIVar1 == (Instruction *)0x0) {
      IVar2 = 0;
    }
    else {
      IVar2 = pIVar1->typeId;
    }
    if ((this->accessChain).isRValue == false) {
      IVar2 = getContainedTypeId(this,IVar2);
    }
    for (pIVar4 = (this->accessChain).indexChain.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pIVar4 != (this->accessChain).indexChain.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish; pIVar4 = pIVar4 + 1) {
      if ((this->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[IVar2]->opCode == OpTypeStruct) {
        member = getConstantScalar(this,*pIVar4);
        IVar2 = getContainedTypeId(this,IVar2,member);
      }
      else {
        IVar2 = getContainedTypeId(this,IVar2);
      }
    }
    uVar3 = (long)(this->accessChain).swizzle.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->accessChain).swizzle.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar3 == 4) {
      IVar2 = getContainedTypeId(this,IVar2);
    }
    else if (4 < uVar3) {
      IVar2 = getContainedTypeId(this,IVar2);
      IVar2 = makeVectorType(this,IVar2,
                             (int)((ulong)((long)(this->accessChain).swizzle.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->accessChain).swizzle.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 2));
    }
    if ((this->accessChain).component != 0) {
      IVar2 = getContainedTypeId(this,IVar2);
      return IVar2;
    }
  }
  return IVar2;
}

Assistant:

Id Builder::accessChainGetInferredType()
{
    // anything to operate on?
    if (accessChain.base == NoResult)
        return NoType;
    Id type = getTypeId(accessChain.base);

    // do initial dereference
    if (! accessChain.isRValue)
        type = getContainedTypeId(type);

    // dereference each index
    for (auto it = accessChain.indexChain.cbegin(); it != accessChain.indexChain.cend(); ++it) {
        if (isStructType(type))
            type = getContainedTypeId(type, getConstantScalar(*it));
        else
            type = getContainedTypeId(type);
    }

    // dereference swizzle
    if (accessChain.swizzle.size() == 1)
        type = getContainedTypeId(type);
    else if (accessChain.swizzle.size() > 1)
        type = makeVectorType(getContainedTypeId(type), (int)accessChain.swizzle.size());

    // dereference component selection
    if (accessChain.component)
        type = getContainedTypeId(type);

    return type;
}